

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IC_Selector.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::IC_Selector::isSerializable(IC_Selector *this)

{
  return true;
}

Assistant:

void IC_Selector::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {
        serEng<<fXPath;
        
        IdentityConstraint::storeIC(serEng, fIdentityConstraint);
    }
    else
    {
        serEng>>fXPath;

        fIdentityConstraint = IdentityConstraint::loadIC(serEng);
    }

}